

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Bool coda_XML_SetBillionLaughsAttackProtectionMaximumAmplification
                   (XML_Parser parser,float maximumAmplificationFactor)

{
  if (((parser != (XML_Parser)0x0) && (parser->m_parentParser == (XML_Parser)0x0)) &&
     (1.0 <= maximumAmplificationFactor)) {
    (parser->m_accounting).maximumAmplificationFactor = maximumAmplificationFactor;
    return '\x01';
  }
  return '\0';
}

Assistant:

XML_Bool XMLCALL
XML_SetBillionLaughsAttackProtectionMaximumAmplification(
    XML_Parser parser, float maximumAmplificationFactor) {
  if ((parser == NULL) || (parser->m_parentParser != NULL)
      || isnan(maximumAmplificationFactor)
      || (maximumAmplificationFactor < 1.0f)) {
    return XML_FALSE;
  }
  parser->m_accounting.maximumAmplificationFactor = maximumAmplificationFactor;
  return XML_TRUE;
}